

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

TransactionError __thiscall
node::anon_unknown_2::NodeImpl::broadcastTransaction
          (NodeImpl *this,CTransactionRef tx,CAmount max_tx_fee,string *err_string)

{
  NodeContext *node;
  pointer pCVar1;
  pointer this_00;
  TransactionError TVar2;
  element_type *peVar3;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  _Alloc_hider local_18;
  pointer local_10;
  
  local_18._M_p =
       (pointer)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar3 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_10 = *(pointer *)(in_FS_OFFSET + 0x28);
  node = this->m_context;
  pCVar1 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)max_tx_fee;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffd8;
  TVar2 = BroadcastTransaction
                    (node,tx_00,(string *)&stack0xffffffffffffffe8,(CAmount *)0x1,false,
                     SUB81(pCVar1,0));
  if (this_00 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_10) {
    return TVar2;
  }
  __stack_chk_fail();
}

Assistant:

TransactionError broadcastTransaction(CTransactionRef tx, CAmount max_tx_fee, std::string& err_string) override
    {
        return BroadcastTransaction(*m_context, std::move(tx), err_string, max_tx_fee, /*relay=*/ true, /*wait_callback=*/ false);
    }